

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O0

int run_test_udp_dual_stack(void)

{
  int iVar1;
  int local_c;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    local_c = 1;
  }
  else {
    do_test(ipv6_recv_ok,0);
    printf("recv_cb_called %d\n",(ulong)(uint)recv_cb_called);
    printf("send_cb_called %d\n",(ulong)(uint)send_cb_called);
    if (recv_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-ipv6.c"
              ,0xea,"recv_cb_called == 1");
      abort();
    }
    if (send_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-ipv6.c"
              ,0xeb,"send_cb_called == 1");
      abort();
    }
    local_c = 0;
  }
  return local_c;
}

Assistant:

TEST_IMPL(udp_dual_stack) {
#if defined(__CYGWIN__) || defined(__MSYS__)
  /* FIXME: Does Cygwin support this?  */
  RETURN_SKIP("FIXME: This test needs more investigation on Cygwin");
#endif

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

#if defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || defined(__NetBSD__)
  if (!can_ipv6_ipv4_dual())
    RETURN_SKIP("IPv6-IPv4 dual stack not supported");
#elif defined(__OpenBSD__)
  RETURN_SKIP("IPv6-IPv4 dual stack not supported");
#endif

  do_test(ipv6_recv_ok, 0);

  printf("recv_cb_called %d\n", recv_cb_called);
  printf("send_cb_called %d\n", send_cb_called);
  ASSERT(recv_cb_called == 1);
  ASSERT(send_cb_called == 1);

  return 0;
}